

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkv_interface.cpp
# Opt level: O1

void __thiscall MkvInterface::handleTracksData(MkvInterface *this)

{
  EbmlElement *pEVar1;
  int *UpperLevel;
  EbmlStream *pEVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  EbmlElement *pEVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  _func_int **pp_Var6;
  int *piVar7;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  int local_6c;
  int local_60;
  int local_5c;
  
  pEVar2 = this->aStream;
  iVar4 = (*this->m_element1->_vptr_EbmlElement[4])();
  UpperLevel = &this->m_upperElementa;
  pEVar5 = libebml::EbmlStream::FindNextElement
                     (pEVar2,*(EbmlSemanticContext **)(CONCAT44(extraout_var,iVar4) + 0x18),
                      UpperLevel,0xffffffff,this->m_allowDummy,1);
  this->m_element2a = pEVar5;
  if ((pEVar5 != (EbmlElement *)0x0) && (iVar4 = this->m_upperElementa, iVar4 < 1)) {
    do {
      if (iVar4 < 0) {
        *UpperLevel = 0;
      }
      iVar4 = (*pEVar5->_vptr_EbmlElement[3])(pEVar5);
      if ((*(long *)(libmatroska::KaxTrackEntry::ClassInfos._8_8_ + 8) ==
           *(long *)((int *)CONCAT44(extraout_var_00,iVar4) + 2)) &&
         (*(int *)libmatroska::KaxTrackEntry::ClassInfos._8_8_ ==
          *(int *)CONCAT44(extraout_var_00,iVar4))) {
        pEVar2 = this->aStream;
        iVar4 = (*this->m_element2a->_vptr_EbmlElement[4])();
        pEVar5 = libebml::EbmlStream::FindNextElement
                           (pEVar2,*(EbmlSemanticContext **)(CONCAT44(extraout_var_01,iVar4) + 0x18)
                            ,UpperLevel,0xffffffff,this->m_allowDummy,1);
        this->m_element3a = pEVar5;
        if (pEVar5 == (EbmlElement *)0x0) {
          local_60 = -1;
          bVar9 = 0;
          local_5c = -1;
        }
        else {
          local_5c = -1;
          bVar9 = 0;
          local_60 = -1;
          do {
            if (0 < *UpperLevel) break;
            if (*UpperLevel < 0) {
              *UpperLevel = 0;
            }
            iVar4 = (*pEVar5->_vptr_EbmlElement[3])(pEVar5);
            if ((*(long *)(libmatroska::KaxTrackNumber::ClassInfos._8_8_ + 8) ==
                 *(long *)((int *)CONCAT44(extraout_var_02,iVar4) + 2)) &&
               (*(int *)libmatroska::KaxTrackNumber::ClassInfos._8_8_ ==
                *(int *)CONCAT44(extraout_var_02,iVar4))) {
              handleTracksData();
              local_5c = local_6c;
            }
            else {
              iVar4 = (*this->m_element3a->_vptr_EbmlElement[3])(this->m_element3a);
              if ((*(long *)(libmatroska::KaxTrackType::ClassInfos._8_8_ + 8) ==
                   *(long *)((int *)CONCAT44(extraout_var_03,iVar4) + 2)) &&
                 (*(int *)libmatroska::KaxTrackType::ClassInfos._8_8_ ==
                  *(int *)CONCAT44(extraout_var_03,iVar4))) {
                handleTracksData();
                bVar9 = (byte)local_6c;
              }
              else {
                iVar4 = (*this->m_element3a->_vptr_EbmlElement[3])(this->m_element3a);
                if ((*(long *)(libmatroska::KaxTrackFlagLacing::ClassInfos._8_8_ + 8) ==
                     *(long *)((int *)CONCAT44(extraout_var_04,iVar4) + 2)) &&
                   (*(int *)libmatroska::KaxTrackFlagLacing::ClassInfos._8_8_ ==
                    *(int *)CONCAT44(extraout_var_04,iVar4))) {
                  handleTracksData();
                }
                else {
                  iVar4 = (*this->m_element3a->_vptr_EbmlElement[3])();
                  if ((*(long *)(libmatroska::KaxCodecID::ClassInfos._8_8_ + 8) ==
                       *(long *)((int *)CONCAT44(extraout_var_05,iVar4) + 2)) &&
                     (*(int *)libmatroska::KaxCodecID::ClassInfos._8_8_ ==
                      *(int *)CONCAT44(extraout_var_05,iVar4))) {
                    handleTracksData();
                  }
                  else {
                    iVar4 = (*this->m_element3a->_vptr_EbmlElement[3])(this->m_element3a);
                    if ((*(long *)(libmatroska::KaxTrackUID::ClassInfos._8_8_ + 8) ==
                         *(long *)((int *)CONCAT44(extraout_var_06,iVar4) + 2)) &&
                       (*(int *)libmatroska::KaxTrackUID::ClassInfos._8_8_ ==
                        *(int *)CONCAT44(extraout_var_06,iVar4))) {
                      handleTracksData();
                      local_60 = local_6c;
                    }
                    else {
                      iVar4 = (*this->m_element3a->_vptr_EbmlElement[3])(this->m_element3a);
                      if ((*(long *)(libmatroska::KaxTrackVideo::ClassInfos._8_8_ + 8) ==
                           *(long *)((int *)CONCAT44(extraout_var_07,iVar4) + 2)) &&
                         (*(int *)libmatroska::KaxTrackVideo::ClassInfos._8_8_ ==
                          *(int *)CONCAT44(extraout_var_07,iVar4))) {
                        pEVar5 = this->m_element3a;
                        pp_Var6 = pEVar5[1]._vptr_EbmlElement;
                        if ((_func_int **)pEVar5[1].Size != pp_Var6) {
                          pEVar1 = pEVar5 + 1;
                          uVar8 = 0;
                          uVar10 = 1;
                          do {
                            piVar7 = (int *)(**(code **)(*(long *)pp_Var6[uVar8] + 0x18))();
                            if ((*(long *)(libmatroska::KaxVideoFlagInterlaced::ClassInfos._8_8_ + 8
                                          ) == *(long *)(piVar7 + 2)) &&
                               (*(int *)libmatroska::KaxVideoFlagInterlaced::ClassInfos._8_8_ ==
                                *piVar7)) {
                              handleTracksData();
                            }
                            else {
                              piVar7 = (int *)(**(code **)(*(long *)pEVar1->_vptr_EbmlElement[uVar8]
                                                          + 0x18))(pEVar1->_vptr_EbmlElement[uVar8])
                              ;
                              if ((*(long *)(libmatroska::KaxVideoPixelWidth::ClassInfos._8_8_ + 8)
                                   == *(long *)(piVar7 + 2)) &&
                                 (*(int *)libmatroska::KaxVideoPixelWidth::ClassInfos._8_8_ ==
                                  *piVar7)) {
                                handleTracksData();
                              }
                              else {
                                piVar7 = (int *)(**(code **)(*(long *)pEVar1->_vptr_EbmlElement
                                                                      [uVar8] + 0x18))
                                                          (pEVar1->_vptr_EbmlElement[uVar8]);
                                if ((*(long *)(libmatroska::KaxVideoPixelHeight::ClassInfos._8_8_ +
                                              8) == *(long *)(piVar7 + 2)) &&
                                   (*(int *)libmatroska::KaxVideoPixelHeight::ClassInfos._8_8_ ==
                                    *piVar7)) {
                                  handleTracksData();
                                }
                                else {
                                  piVar7 = (int *)(**(code **)(*(long *)pEVar1->_vptr_EbmlElement
                                                                        [uVar8] + 0x18))
                                                            (pEVar1->_vptr_EbmlElement[uVar8]);
                                  if ((*(long *)(libmatroska::KaxVideoFrameRate::ClassInfos._8_8_ +
                                                8) == *(long *)(piVar7 + 2)) &&
                                     (*(int *)libmatroska::KaxVideoFrameRate::ClassInfos._8_8_ ==
                                      *piVar7)) {
                                    handleTracksData();
                                  }
                                }
                              }
                            }
                            pp_Var6 = pEVar5[1]._vptr_EbmlElement;
                            bVar3 = uVar10 < (ulong)((long)(pEVar5[1].Size - (long)pp_Var6) >> 3);
                            uVar8 = uVar10;
                            uVar10 = (ulong)((int)uVar10 + 1);
                          } while (bVar3);
                        }
                      }
                    }
                  }
                }
              }
            }
            pEVar2 = this->aStream;
            pEVar5 = this->m_element3a;
            iVar4 = (*pEVar5->_vptr_EbmlElement[4])(pEVar5);
            libebml::EbmlElement::SkipData
                      (pEVar5,pEVar2,
                       *(EbmlSemanticContext **)(CONCAT44(extraout_var_08,iVar4) + 0x18),
                       (EbmlElement *)0x0,false);
            if (this->m_element3a != (EbmlElement *)0x0) {
              (*this->m_element3a->_vptr_EbmlElement[1])();
            }
            pEVar2 = this->aStream;
            iVar4 = (*this->m_element2a->_vptr_EbmlElement[4])();
            pEVar5 = libebml::EbmlStream::FindNextElement
                               (pEVar2,*(EbmlSemanticContext **)
                                        (CONCAT44(extraout_var_09,iVar4) + 0x18),UpperLevel,
                                0xffffffff,this->m_allowDummy,1);
            this->m_element3a = pEVar5;
          } while (pEVar5 != (EbmlElement *)0x0);
        }
        if ((bVar9 & 1) != 0) {
          this->m_trackNr = local_5c;
          this->m_trackUID = local_60;
        }
      }
      if (*UpperLevel < 1) {
        pEVar2 = this->aStream;
        pEVar5 = this->m_element2a;
        iVar4 = (*pEVar5->_vptr_EbmlElement[4])(pEVar5);
        libebml::EbmlElement::SkipData
                  (pEVar5,pEVar2,*(EbmlSemanticContext **)(CONCAT44(extraout_var_10,iVar4) + 0x18),
                   (EbmlElement *)0x0,false);
        if (this->m_element2a != (EbmlElement *)0x0) {
          (*this->m_element2a->_vptr_EbmlElement[1])();
        }
        pEVar2 = this->aStream;
        iVar4 = (*this->m_element1->_vptr_EbmlElement[4])();
        pEVar5 = libebml::EbmlStream::FindNextElement
                           (pEVar2,*(EbmlSemanticContext **)(CONCAT44(extraout_var_11,iVar4) + 0x18)
                            ,UpperLevel,0xffffffff,this->m_allowDummy,1);
        this->m_element2a = pEVar5;
      }
      else {
        this->m_upperElementa = *UpperLevel + -1;
        if (this->m_element2a != (EbmlElement *)0x0) {
          (*this->m_element2a->_vptr_EbmlElement[1])();
        }
        pEVar5 = this->m_element3a;
        this->m_element2a = pEVar5;
        if (0 < this->m_upperElementa) break;
      }
      if ((pEVar5 == (EbmlElement *)0x0) || (iVar4 = *UpperLevel, 0 < iVar4)) break;
    } while( true );
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void MkvInterface::handleTracksData()
{
    // handle the data in Tracks here.
    // poll for new tracks and handle them
    m_element2a = aStream->FindNextElement(m_element1->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);

    while (m_element2a != NULL) 
    {
        if (m_upperElementa > 0) break;
        if (m_upperElementa < 0) m_upperElementa = 0;
        
        if (EbmlId(*m_element2a) == KaxTrackEntry::ClassInfos.GlobalId)
        {
            m_element3a = aStream->FindNextElement(m_element2a->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
            
            bool videoTrackFound = false;
            int trackNr = -1, trackUID = -1;
            
            while (m_element3a != NULL)
            {
                if (m_upperElementa > 0)
                    break;
                if (m_upperElementa < 0)
                    m_upperElementa = 0;
                    
                // read the data we care about in a track
                // Track number
                if (EbmlId(*m_element3a) == KaxTrackNumber::ClassInfos.GlobalId)
                {
                    KaxTrackNumber & TrackNum = *static_cast<KaxTrackNumber*>(m_element3a);
                    TrackNum.ReadData(aStream->I_O());
                    trackNr = uint8(TrackNum);
                    fprintf(stderr, "\tTrack # %d\n", trackNr);
                }
                
                // Track type
                else if (EbmlId(*m_element3a) == KaxTrackType::ClassInfos.GlobalId)
                {
                    KaxTrackType & TrackType = *static_cast<KaxTrackType*>(m_element3a);
                    TrackType.ReadData(aStream->I_O());
                    fprintf(stderr, "\tTrack type : ");
                    switch(uint8(TrackType))
                    {
                        case track_audio:
                            fprintf(stderr, "Audio");
                            break;
                        case track_video:
                            fprintf(stderr, "Video");
                            videoTrackFound = true;
                            break;
                        default:
                            fprintf(stderr, "unknown");
                    }
                    fprintf(stderr, "\n");
                }

                else if (EbmlId(*m_element3a) == KaxTrackFlagLacing::ClassInfos.GlobalId)
                {
                    fprintf(stderr, "\tFlag Lacing\n");
                }
                else if (EbmlId(*m_element3a) == KaxCodecID::ClassInfos.GlobalId)
                {
                    KaxCodecID & CodecID = *static_cast<KaxCodecID*>(m_element3a);
                    CodecID.ReadData(aStream->I_O());
                    fprintf(stderr, "\tCodec ID   : %s\n", std::string(CodecID).c_str());
                }
                else if (EbmlId(*m_element3a) == KaxTrackUID::ClassInfos.GlobalId)
                {
                    KaxTrackUID & TrackUID = *static_cast<KaxTrackUID*>(m_element3a);
                    TrackUID.ReadData(aStream->I_O());
                    trackUID = (unsigned int)TrackUID;
                    fprintf(stderr, "\tTrack UID   : %d\n", trackUID);
                }
                else if (EbmlId(*m_element3a) == KaxTrackVideo::ClassInfos.GlobalId)
                {
                    KaxTrackVideo & TrackVideo = *static_cast<KaxTrackVideo*>(m_element3a);
                    for (unsigned int j = 0; j<TrackVideo.ListSize(); j++)
                    {
                        if (EbmlId(*TrackVideo[j]) == KaxVideoFlagInterlaced::ClassInfos.GlobalId) 
                        {
	                        KaxVideoFlagInterlaced &Interlaced = *static_cast<KaxVideoFlagInterlaced*>(TrackVideo[j]);
	                        Interlaced.ReadData(aStream->I_O());
	                        fprintf(stderr, "\tInterlaced : %d\n", (unsigned int)Interlaced);
                        }
                        else if (EbmlId(*TrackVideo[j]) == KaxVideoPixelWidth::ClassInfos.GlobalId)
                        {
	                        KaxVideoPixelWidth &PixelWidth = *static_cast<KaxVideoPixelWidth*>(TrackVideo[j]);
	                        PixelWidth.ReadData(aStream->I_O());
	                        fprintf(stderr, "\tPixelWidth : %d\n", (unsigned int)PixelWidth);
                        }
                        else if (EbmlId(*TrackVideo[j]) == KaxVideoPixelHeight::ClassInfos.GlobalId)
                        {
	                        KaxVideoPixelHeight &PixelHeight = *static_cast<KaxVideoPixelHeight*>(TrackVideo[j]);
	                        PixelHeight.ReadData(aStream->I_O());
	                        fprintf(stderr, "\tPixelHeight : %d\n", (unsigned int)PixelHeight);
                        }
                        else if (EbmlId(*TrackVideo[j]) == KaxVideoFrameRate::ClassInfos.GlobalId)
                        {
	                        KaxVideoFrameRate &FrameRate = *static_cast<KaxVideoFrameRate*>(TrackVideo[j]);
	                        FrameRate.ReadData(aStream->I_O());
	                        fprintf(stderr, "\tFrameRate : %f\n", (float)FrameRate);
                        }				
                    }
                }
                
                m_element3a->SkipData(*aStream, m_element3a->Generic().Context);
                delete m_element3a;

                m_element3a = aStream->FindNextElement(m_element2a->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
            }
            
            if (videoTrackFound)
            {
                m_trackNr = trackNr;
                m_trackUID = trackUID;
            }
        }
        if (m_upperElementa > 0)
        {
            m_upperElementa--;
            delete m_element2a;
            m_element2a = m_element3a;
            if (m_upperElementa > 0)
                break;
        } 
        else
        {
            m_element2a->SkipData(*aStream, m_element2a->Generic().Context);
            delete m_element2a;

            m_element2a = aStream->FindNextElement(m_element1->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
        }
    }
    fprintf(stderr, "\n");
}